

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.h
# Opt level: O0

void __thiscall CTextCursor::Reset(CTextCursor *this,int64 StringVersion)

{
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *in_RSI;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((long)in_RSI < 0) ||
     (*(array<CScaledGlyph,_allocator_default<CScaledGlyph>_> **)(in_RDI + 0x10) != in_RSI)) {
    *in_RDI = 0;
    in_RDI[1] = 0;
    in_RDI[0xb] = 0;
    vector2_base<float>::vector2_base(&local_10,0.0,0.0);
    *(vector2_base<float> *)(in_RDI + 8) = local_10;
    in_RDI[4] = 1;
    in_RDI[5] = 0;
    in_RDI[2] = 0xffffffff;
    *(undefined1 *)(in_RDI + 3) = 0;
    *(undefined1 *)(in_RDI + 0x18) = 1;
    array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::set_size
              (in_RSI,(int)((ulong)in_RDI >> 0x20));
    *(array<CScaledGlyph,_allocator_default<CScaledGlyph>_> **)(in_RDI + 0x10) = in_RSI;
    *(undefined1 *)(in_RDI + 10) = 0;
  }
  else {
    *(undefined1 *)(in_RDI + 10) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Reset(int64 StringVersion = -1)
	{
		if (StringVersion < 0 || m_StringVersion != StringVersion)
		{
			m_Width = 0;
			m_Height = 0;
			m_NextLineAdvanceY = 0;
			m_Advance = vec2(0, 0);
			m_LineCount = 1;
			m_CharCount = 0;
			m_PageCountWhenDrawn = -1;
			m_Truncated = false;
			m_StartOfLine = true;
			m_Glyphs.set_size(0);
			m_StringVersion = StringVersion;
			m_SkipTextRender = false;
		}
		else
		{
			m_SkipTextRender = true;
		}
	}